

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void analyzeAggFuncArgs(AggInfo *pAggInfo,NameContext *pNC)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pbVar1 = (byte *)((long)&pNC->ncFlags + 2);
  *pbVar1 = *pbVar1 | 2;
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < pAggInfo->nFunc; lVar3 = lVar3 + 1) {
    lVar2 = *(long *)((long)&pAggInfo->aFunc->pFExpr + lVar4);
    sqlite3ExprAnalyzeAggList(pNC,*(ExprList **)(lVar2 + 0x20));
    if (*(long *)(lVar2 + 0x10) != 0) {
      sqlite3ExprAnalyzeAggList(pNC,*(ExprList **)(*(long *)(lVar2 + 0x10) + 0x20));
    }
    if ((*(byte *)(lVar2 + 7) & 1) != 0) {
      sqlite3ExprAnalyzeAggregates(pNC,*(Expr **)(*(long *)(lVar2 + 0x40) + 0x48));
    }
    lVar4 = lVar4 + 0x20;
  }
  pbVar1 = (byte *)((long)&pNC->ncFlags + 2);
  *pbVar1 = *pbVar1 & 0xfd;
  return;
}

Assistant:

static void analyzeAggFuncArgs(
  AggInfo *pAggInfo,
  NameContext *pNC
){
  int i;
  assert( pAggInfo!=0 );
  assert( pAggInfo->iFirstReg==0 );
  pNC->ncFlags |= NC_InAggFunc;
  for(i=0; i<pAggInfo->nFunc; i++){
    Expr *pExpr = pAggInfo->aFunc[i].pFExpr;
    assert( pExpr->op==TK_FUNCTION || pExpr->op==TK_AGG_FUNCTION );
    assert( ExprUseXList(pExpr) );
    sqlite3ExprAnalyzeAggList(pNC, pExpr->x.pList);
    if( pExpr->pLeft ){
      assert( pExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pExpr->pLeft) );
      sqlite3ExprAnalyzeAggList(pNC, pExpr->pLeft->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    assert( !IsWindowFunc(pExpr) );
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      sqlite3ExprAnalyzeAggregates(pNC, pExpr->y.pWin->pFilter);
    }
#endif
  }
  pNC->ncFlags &= ~NC_InAggFunc;
}